

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

FPolyObj * __thiscall FPolyMirrorIterator::NextMirror(FPolyMirrorIterator *this)

{
  int iVar1;
  uint polyNum;
  int local_30;
  int i;
  int mirror;
  FPolyObj *nextpoly;
  FPolyObj *poly;
  FPolyMirrorIterator *this_local;
  
  this_local = (FPolyMirrorIterator *)this->CurPoly;
  if (this_local == (FPolyMirrorIterator *)0x0) {
    this_local = (FPolyMirrorIterator *)0x0;
  }
  else {
    polyNum = FPolyObj::GetMirror((FPolyObj *)this_local);
    _i = (FPolyObj *)0x0;
    if ((polyNum != 0) && (this->NumUsedPolys != 100)) {
      for (local_30 = 0; (local_30 < this->NumUsedPolys && (this->UsedPolys[local_30] != polyNum));
          local_30 = local_30 + 1) {
      }
      if (local_30 == this->NumUsedPolys) {
        iVar1 = this->NumUsedPolys;
        this->NumUsedPolys = iVar1 + 1;
        this->UsedPolys[iVar1] = polyNum;
        _i = PO_GetPolyobj(polyNum);
        if (_i == (FPolyObj *)0x0) {
          Printf("Invalid mirror polyobj num %d for polyobj num %d\n",(ulong)polyNum,
                 (ulong)(uint)this->UsedPolys[local_30 + -1]);
        }
      }
    }
    this->CurPoly = _i;
  }
  return (FPolyObj *)this_local;
}

Assistant:

FPolyObj *FPolyMirrorIterator::NextMirror()
{
	FPolyObj *poly = CurPoly, *nextpoly;

	if (poly == NULL)
	{
		return NULL;
	}

	// Do the work to decide which polyobject to return the next time this
	// function is called.
	int mirror = poly->GetMirror(), i;
	nextpoly = NULL;

	// Is there a mirror and we have room to remember it?
	if (mirror != 0 && NumUsedPolys != countof(UsedPolys))
	{
		// Has this polyobject been returned already?
		for (i = 0; i < NumUsedPolys; ++i)
		{
			if (UsedPolys[i] == mirror)
			{
				break;	// Yes, it has been returned.
			}
		}
		if (i == NumUsedPolys)
		{ // No, it has not been returned.
			UsedPolys[NumUsedPolys++] = mirror;
			nextpoly = PO_GetPolyobj(mirror);
			if (nextpoly == NULL)
			{
				Printf("Invalid mirror polyobj num %d for polyobj num %d\n", mirror, UsedPolys[i - 1]);
			}
		}
	}
	CurPoly = nextpoly;
	return poly;
}